

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *ppbVar1;
  _Rb_tree_header *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  byte bVar4;
  _Ios_Seekdir _Var5;
  undefined8 uVar6;
  pointer pcVar7;
  size_type sVar8;
  long lVar9;
  _Alloc_hider *p_Var10;
  size_type *psVar11;
  _Alloc_hider _Var12;
  char cVar13;
  bool bVar14;
  int iVar15;
  mapped_type mVar16;
  int iVar17;
  int iVar18;
  char *pcVar19;
  typed_value<int,_char> *ptVar20;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar21;
  const_iterator cVar22;
  long *plVar23;
  const_iterator cVar24;
  any *paVar25;
  uint *puVar26;
  ostream *poVar27;
  mapped_type *pmVar28;
  pointer pbVar29;
  _Ios_Seekdir *p_Var30;
  int *arg;
  long lVar31;
  long **pplVar32;
  key_type *pkVar33;
  _Ios_Iostate _Var34;
  int *__s;
  undefined1 *puVar35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar36;
  undefined1 auVar37 [8];
  ulong uVar38;
  uint regnumber;
  undefined8 uStack_550;
  long *local_548;
  options_description desc;
  long local_538 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_520 [24];
  void *local_508;
  undefined4 local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  long local_4e8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_4e0 [24];
  undefined1 local_4c8 [8];
  positional_options_description p;
  long *local_4b0;
  long local_4a0 [2];
  undefined1 local_490 [8];
  ifstream source_file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  byte abStack_470 [16];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_460 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_440 [32];
  options_description *local_420;
  anon_union_16_2_ba345be5_for_m_Storage local_288;
  ulong local_278;
  anon_union_16_2_ba345be5_for_m_Storage local_270;
  ulong local_260;
  anon_union_16_2_ba345be5_for_m_Storage local_258;
  ulong local_248;
  undefined1 *local_240;
  ulong local_238;
  code *local_230;
  variables_map vm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_220 [8];
  _Rb_tree_node_base local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  undefined1 local_190 [8];
  string intapetmp;
  size_type *local_158;
  string filename;
  string outtape;
  string fetch;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  know_label;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  intape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line_1;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line;
  
  pplVar32 = &local_548;
  uStack_550 = 0x10e838;
  local_490 = (undefined1  [8])&local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"SimRam - RAM Emulator","");
  uStack_550 = 0x10e858;
  boost::program_options::options_description::options_description
            ((options_description *)&local_548,(string *)local_490,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if (local_490 != (undefined1  [8])&local_480) {
    uStack_550 = 0x10e873;
    operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
  }
  uStack_550 = 0x10e87f;
  local_490 = (undefined1  [8])boost::program_options::options_description::add_options();
  uStack_550 = 0x10e89c;
  pcVar19 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_490,"help,h");
  uStack_550 = 0x10e8b2;
  pcVar19 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar19,"verbose,v");
  uStack_550 = 0x10e8bc;
  ptVar20 = boost::program_options::value<int>((int *)0x0);
  uStack_550 = 0x10e8d5;
  pcVar19 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar19,(value_semantic *)"registers,r",(char *)ptVar20);
  uStack_550 = 0x10e8df;
  ptVar21 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uStack_550 = 0x10e8f8;
  boost::program_options::options_description_easy_init::operator()
            (pcVar19,(value_semantic *)"input,i",(char *)ptVar21);
  uStack_550 = 0x10e904;
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)local_4c8);
  uStack_550 = 0x10e91c;
  boost::program_options::positional_options_description::add(local_4c8,0x1190da);
  uStack_550 = 0x10e928;
  boost::program_options::variables_map::variables_map((variables_map *)&local_230);
  uStack_550 = 0x10e93a;
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_490,argc,argv);
  uStack_550 = 0x10e950;
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_490)
  ;
  uStack_550 = 0x10e967;
  local_420 = (options_description *)&local_548;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_490);
  uStack_550 = 0x10e97a;
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)((long)&fetch.field_2 + 8),
             (basic_command_line_parser<char> *)local_490);
  uStack_550 = 0x10e98f;
  boost::program_options::store
            ((basic_parsed_options *)(fetch.field_2._M_local_buf + 8),(variables_map *)&local_230,
             false);
  uStack_550 = 0x10e99b;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)((long)&fetch.field_2 + 8));
  uStack_550 = 0x10e9a7;
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_440);
  uStack_550 = 0x10e9b3;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_460);
  uStack_550 = 0x10e9bf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_490);
  uStack_550 = 0x10e9cb;
  boost::program_options::notify((variables_map *)&local_230);
  uStack_550 = 0x10e9e8;
  local_490 = (undefined1  [8])&local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"help","");
  uStack_550 = 0x10e9fe;
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_220,(key_type *)local_490);
  if (local_490 != (undefined1  [8])&local_480) {
    uStack_550 = 0x10ea23;
    operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
  }
  if (cVar22._M_node == &local_218) {
    uStack_550 = 0x10ea8d;
    local_490 = (undefined1  [8])&local_480;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"reg","");
    uStack_550 = 0x10ea9c;
    cVar24 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_220,(key_type *)local_490);
    if (local_490 != (undefined1  [8])&local_480) {
      uStack_550 = 0x10eaba;
      operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
    }
    if (cVar24._M_node == cVar22._M_node) {
      regnumber = 5;
    }
    else {
      uStack_550 = 0x10eae0;
      local_490 = (undefined1  [8])&local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"reg","");
      uStack_550 = 0x10eaf3;
      paVar25 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)&local_230);
      uStack_550 = 0x10eafb;
      puVar26 = (uint *)boost::any_cast<int_const&>(paVar25);
      regnumber = *puVar26;
      if (local_490 != (undefined1  [8])&local_480) {
        uStack_550 = 0x10eb19;
        operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
      }
      uStack_550 = 0x10eb36;
      local_490 = (undefined1  [8])&local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"verbose","");
      uStack_550 = 0x10eb45;
      cVar24 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_220,(key_type *)local_490);
      if (local_490 != (undefined1  [8])&local_480) {
        uStack_550 = 0x10eb63;
        operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
      }
      if (cVar24._M_node != cVar22._M_node) {
        uStack_550 = 0x10eb80;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The number of virtual registers was set to ",0x2b);
        uStack_550 = 0x10eb8f;
        plVar23 = (long *)std::ostream::operator<<((ostream *)&std::cout,regnumber);
        uStack_550 = 0x10eba6;
        std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
        uStack_550 = 0x10ebb1;
        std::ostream::put((char)plVar23);
        uStack_550 = 0x10ebb9;
        std::ostream::flush();
      }
    }
    local_158 = &filename._M_string_length;
    uStack_550 = 0x10ebe6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"input.ram","");
    uStack_550 = 0x10ec03;
    local_490 = (undefined1  [8])&local_480;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"input","");
    uStack_550 = 0x10ec12;
    cVar24 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_220,(key_type *)local_490);
    if (local_490 != (undefined1  [8])&local_480) {
      uStack_550 = 0x10ec30;
      operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
    }
    if (cVar24._M_node != cVar22._M_node) {
      uStack_550 = 0x10ec56;
      local_490 = (undefined1  [8])&local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"input","");
      uStack_550 = 0x10ec69;
      paVar25 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)&local_230);
      uStack_550 = 0x10ec71;
      boost::any_cast<std::__cxx11::string_const&>(paVar25);
      uStack_550 = 0x10ec80;
      std::__cxx11::string::_M_assign((string *)&local_158);
      if (local_490 != (undefined1  [8])&local_480) {
        uStack_550 = 0x10ec9b;
        operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
      }
      uStack_550 = 0x10ecb8;
      local_490 = (undefined1  [8])&local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"verbose","");
      uStack_550 = 0x10ecc7;
      cVar24 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_220,(key_type *)local_490);
      if (local_490 != (undefined1  [8])&local_480) {
        uStack_550 = 0x10ece5;
        operator_delete((void *)local_490,local_480._M_allocated_capacity + 1);
      }
      if (cVar24._M_node != cVar22._M_node) {
        uStack_550 = 0x10ed02;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The source code was set to \'",0x1c);
        uStack_550 = 0x10ed1c;
        poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_158,(long)filename._M_dataplus._M_p
                            );
        uStack_550 = 0x10ed33;
        std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\'",1);
        uStack_550 = 0x10ed47;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
        uStack_550 = 0x10ed52;
        std::ostream::put((char)poVar27);
        uStack_550 = 0x10ed5a;
        std::ostream::flush();
      }
    }
    uStack_550 = 0x10ed72;
    std::ifstream::ifstream(local_490,(char *)local_158,_S_in);
    uStack_550 = 0x10ed7e;
    cVar13 = std::__basic_file<char>::is_open();
    if (cVar13 == '\0') {
      uStack_550 = 0x11111c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<!> Unable to open file",0x17);
      uStack_550 = 0x111130;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      uStack_550 = 0x11113f;
      std::ostream::put(-8);
      iVar15 = 1;
      uStack_550 = 0x11114d;
      std::ostream::flush();
      pplVar32 = &local_548;
    }
    else {
      lVar9 = -((ulong)regnumber * 4 + 0xf & 0xfffffffffffffff0);
      __s = (int *)((long)&local_548 + lVar9);
      local_240 = (undefined1 *)&local_548;
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10edb9;
      memset(__s,0,(long)(int)regnumber << 2);
      local_190 = (undefined1  [8])&intapetmp._M_string_length;
      intapetmp._M_dataplus._M_p = (pointer)0x0;
      intapetmp._M_string_length._0_1_ = 0;
      filename.field_2._8_8_ = &outtape._M_string_length;
      outtape._M_dataplus._M_p = (pointer)0x0;
      outtape._M_string_length._0_1_ = 0;
      intape.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      know_label._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      intape.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ee04;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Insert input tape (use comma for insert new value): ",0x34);
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ee17;
      std::operator>>((istream *)&std::cin,(string *)local_190);
      fetch.field_2._8_8_ = anon_var_dwarf_d671;
      know_label._M_t._M_impl._0_8_ = (long)"," + 1;
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ee3f;
      boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                ((is_any_ofF<char> *)&local_270,
                 (iterator_range<const_char_*> *)((long)&fetch.field_2 + 8));
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ee5e;
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&know_label._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 (is_any_ofF<char> *)&local_270,token_compress_off);
      if ((0x10 < local_260) && (local_270.m_dynSet != (set_value_type *)0x0)) {
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ee79;
        operator_delete__(local_270.m_dynSet);
      }
      p_Var2 = &know_label._M_t._M_impl.super__Rb_tree_header;
      fetch.field_2._8_8_ = p_Var2;
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ee9e;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&fetch.field_2 + 8),"verbose","");
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10eeb1;
      cVar24 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_220,(key_type *)((long)&fetch.field_2 + 8));
      uVar6 = fetch.field_2._8_8_;
      if ((_Rb_tree_header *)fetch.field_2._8_8_ != p_Var2) {
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10eecf;
        operator_delete((void *)uVar6,
                        know_label._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      if (cVar24._M_node != cVar22._M_node) {
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10eeec;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"There are ",10);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ef0a;
        poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ef21;
        std::__ostream_insert<char,std::char_traits<char>>(poVar27," values in the tape.",0x14);
        uVar6 = *(undefined8 *)(*(long *)poVar27 + -0x18);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ef35;
        std::ios::widen((char)uVar6 + (char)poVar27);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ef40;
        std::ostream::put((char)poVar27);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ef48;
        std::ostream::flush();
      }
      local_238 = (ulong)regnumber;
      result.field_2._8_8_ = cVar22._M_node;
      outtape.field_2._8_8_ = &fetch._M_string_length;
      fetch._M_dataplus._M_p = (pointer)0x0;
      fetch._M_string_length._0_1_ = 0;
      know_label._M_t._M_impl._0_8_ = know_label._M_t._M_impl._0_8_ & 0xffffffff00000000;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&know_label;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&know_label;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      puVar35 = local_490 + *(long *)((long)local_490 + -0x18);
      _Var34 = (_Ios_Iostate)puVar35;
      if ((abStack_470[*(long *)((long)local_490 + -0x18)] & 2) == 0) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (outtape.field_2._M_local_buf + 8);
        do {
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10efce;
          cVar13 = std::ios::widen((char)puVar35);
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10efdc;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_490,(string *)pbVar3,cVar13);
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10efe7;
          iVar15 = std::__cxx11::string::compare((char *)pbVar3);
          if ((iVar15 != 0) && (*(char *)outtape.field_2._8_8_ != '#')) {
            auStack_58 = (undefined1  [8])0x0;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            intape.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x119334;
            result._M_dataplus._M_p = "";
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f040;
            boost::algorithm::detail::is_any_ofF<char>::
            is_any_ofF<boost::iterator_range<char_const*>>
                      ((is_any_ofF<char> *)&local_288,
                       (iterator_range<const_char_*> *)
                       &intape.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f053;
            boost::algorithm::
            split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_58,pbVar3,(is_any_ofF<char> *)&local_288,token_compress_off);
            uVar6 = local_288.m_dynSet;
            if ((0x10 < local_278) && (local_288.m_dynSet != (set_value_type *)0x0)) {
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f06e;
              operator_delete__((void *)uVar6);
            }
            auVar37 = auStack_58;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f07e;
            iVar15 = std::__cxx11::string::compare((char *)auVar37);
            if (iVar15 == 0) {
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f08a;
              mVar16 = std::istream::tellg();
              pkVar33 = (key_type *)((long)auStack_58 + 0x20);
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f0a1;
              pmVar28 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)((long)&fetch.field_2 + 8),pkVar33);
              *pmVar28 = mVar16;
            }
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f0ab;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_58);
          }
          puVar35 = local_490 + *(long *)((long)local_490 + -0x18);
          _Var34 = (_Ios_Iostate)puVar35;
        } while ((abStack_470[*(long *)((long)local_490 + -0x18)] & 2) == 0);
      }
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f0d2;
      std::ios::clear(_Var34);
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f0e2;
      std::istream::seekg((long)local_490,_S_beg);
      if ((abStack_470[*(long *)((long)local_490 + -0x18)] & 2) == 0) {
        puVar35 = local_490 + *(long *)((long)local_490 + -0x18);
        iVar15 = 0;
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (outtape.field_2._M_local_buf + 8);
        while( true ) {
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f12f;
          cVar13 = std::ios::widen((char)puVar35);
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f13d;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_490,(string *)pbVar3,cVar13);
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f148;
          iVar17 = std::__cxx11::string::compare((char *)pbVar3);
          if (iVar17 == 0) {
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11116a;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Completed execution with output: ",0x21);
            _Var12 = outtape._M_dataplus;
            uVar6 = filename.field_2._8_8_;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111184;
            poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)uVar6,(long)_Var12._M_p);
            uVar6 = *(undefined8 *)(*(long *)poVar27 + -0x18);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11119b;
            std::ios::widen((char)uVar6 + (char)poVar27);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1111a6;
            std::ostream::put((char)poVar27);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1111ae;
            std::ostream::flush();
            goto LAB_001111ae;
          }
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f15b;
          iVar17 = std::__cxx11::string::compare((char *)pbVar3);
          if ((iVar17 != 0) && (*(char *)outtape.field_2._8_8_ != '#')) break;
          puVar35 = local_490 + *(long *)((long)local_490 + -0x18);
          bVar4 = abStack_470[*(long *)((long)local_490 + -0x18)];
joined_r0x0010f9a2:
          if ((bVar4 & 2) != 0) goto LAB_001111ae;
        }
        auStack_88 = (undefined1  [8])0x0;
        line_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        line_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_58 = (undefined1  [8])0x119334;
        line.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x119335;
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f1c1;
        boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                  ((is_any_ofF<char> *)&local_258,(iterator_range<const_char_*> *)auStack_58);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f1d9;
        boost::algorithm::
        split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_88,pbVar3,(is_any_ofF<char> *)&local_258,token_compress_off);
        uVar6 = local_258.m_dynSet;
        ppbVar1 = &line.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if ((0x10 < local_248) && (local_258.m_dynSet != (set_value_type *)0x0)) {
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f1fc;
          operator_delete__((void *)uVar6);
        }
        auVar37 = auStack_88;
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f20c;
        iVar17 = std::__cxx11::string::compare((char *)auVar37);
        auVar37 = auStack_88;
        if (iVar17 == 0) {
          auStack_58 = (undefined1  [8])ppbVar1;
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f5bc;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f5cb;
          cVar22 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   ::find(local_220,(key_type *)auStack_58);
          auVar37 = auStack_58;
          if (auStack_58 != (undefined1  [8])ppbVar1) {
            p_Var10 = &(line.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f5e3;
            operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
          }
          if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f608;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read: ",6);
            pcVar19 = *(char **)(know_label._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                (long)iVar15 * 0x20);
            lVar31 = *(long *)(know_label._M_t._M_impl.super__Rb_tree_header._M_node_count + 8 +
                              (long)iVar15 * 0x20);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f62b;
            poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar19,lVar31);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f642;
            std::__ostream_insert<char,std::char_traits<char>>(poVar27," --> M[",7);
            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
            sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f656;
            poVar27 = std::__ostream_insert<char,std::char_traits<char>>(poVar27,pcVar19,sVar8);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f66d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,"]",1);
            uVar6 = *(undefined8 *)(*(long *)poVar27 + -0x18);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f681;
            std::ios::widen((char)uVar6 + (char)poVar27);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f68c;
            std::ostream::put((char)poVar27);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f694;
            std::ostream::flush();
          }
          intape.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)intape.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffff00000000);
          auStack_58 = (undefined1  [8])(((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
          line.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                        ((pointer)((long)auStack_88 + 0x20))->_M_string_length);
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f6c5;
          bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                   shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)
                                   auStack_58,
                                   (int *)&intape.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar14) {
            auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111449;
            boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
          }
          iVar17 = (int)intape.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f6db;
          bVar14 = error_registers(iVar17,regnumber);
          if (!bVar14) {
            if ((ulong)(long)iVar15 <
                (ulong)((long)((long)intape.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                              know_label._M_t._M_impl.super__Rb_tree_header._M_node_count) >> 5)) {
              lVar31 = (long)iVar15 * 0x20;
              intape.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)intape.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffff00000000);
              auStack_58 = *(undefined1 (*) [8])
                            (know_label._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar31);
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                            *(long *)(know_label._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                      8 + lVar31));
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f736;
              bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                       shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *
                                       )auStack_58,
                                       (int *)&intape.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (!bVar14) {
                auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo
                ;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111472;
                boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
              }
              iVar17 = (int)intape.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              intape.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)intape.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffff00000000);
              auStack_58 = (undefined1  [8])(((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p
              ;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                            ((pointer)((long)auStack_88 + 0x20))->_M_string_length);
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f775;
              bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                       shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *
                                       )auStack_58,
                                       (int *)&intape.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (!bVar14) {
                auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo
                ;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11149b;
                boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
              }
              iVar18 = (int)intape.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_0010f96b:
              __s[iVar18] = iVar17;
              iVar15 = iVar15 + 1;
              goto LAB_0010f971;
            }
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111373;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"<!> The input tape is finished.",0x1f);
            uVar6 = *(undefined8 *)(std::cerr + -0x18);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111387;
            std::ios::widen((char)uVar6 + 'x');
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111396;
            std::ostream::put('x');
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11139e;
            std::ostream::flush();
          }
        }
        else {
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f224;
          iVar17 = std::__cxx11::string::compare((char *)auVar37);
          auVar37 = auStack_88;
          if (iVar17 != 0) {
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f23c;
            iVar17 = std::__cxx11::string::compare((char *)auVar37);
            auVar37 = auStack_88;
            if (iVar17 == 0) {
              auStack_58 = (undefined1  [8])ppbVar1;
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f9c7;
              std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f9d6;
              cVar22 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::find(local_220,(key_type *)auStack_58);
              auVar37 = auStack_58;
              if (auStack_58 != (undefined1  [8])ppbVar1) {
                p_Var10 = &(line.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f9ee;
                operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
              }
              if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fa13;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Write: M[",9);
                pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fa2b;
                poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar19,sVar8);
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fa42;
                std::__ostream_insert<char,std::char_traits<char>>(poVar27,"] = ",4);
                intape.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)intape.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffff00000000);
                auStack_58 = (undefined1  [8])
                             (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                              ((pointer)((long)auStack_88 + 0x20))->_M_string_length);
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fa73;
                bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                         shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_>
                                          *)auStack_58,
                                         (int *)&intape.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                ;
                if (!bVar14) {
                  auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
                  line.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)&std::__cxx11::string::typeinfo;
                  line.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111610;
                  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
                }
                iVar17 = __s[(int)intape.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage];
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fa91;
                plVar23 = (long *)std::ostream::operator<<((ostream *)poVar27,iVar17);
                uVar6 = *(undefined8 *)(*plVar23 + -0x18);
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10faa8;
                std::ios::widen((char)uVar6 + (char)plVar23);
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fab3;
                std::ostream::put((char)plVar23);
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fabb;
                std::ostream::flush();
              }
              intape.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)intape.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffff00000000);
              auStack_58 = (undefined1  [8])(((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p
              ;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                            ((pointer)((long)auStack_88 + 0x20))->_M_string_length);
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10faec;
              bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                       shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *
                                       )auStack_58,
                                       (int *)&intape.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (!bVar14) {
                auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo
                ;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111516;
                boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
              }
              iVar17 = (int)intape.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fb02;
              bVar14 = error_registers(iVar17,regnumber);
              if (bVar14) goto LAB_001113c3;
              intapetmp.field_2._8_4_ = 0;
              auStack_58 = (undefined1  [8])(((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p
              ;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                            ((pointer)((long)auStack_88 + 0x20))->_M_string_length);
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fb3b;
              bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                       shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *
                                       )auStack_58,(int *)(intapetmp.field_2._M_local_buf + 8));
              if (!bVar14) {
                auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo
                ;
                line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11153f;
                boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
              }
              result._M_dataplus._M_p = (pointer)0x0;
              result._M_string_length._0_1_ = 0;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(auStack_58 + 2);
              iVar17 = __s[(int)intapetmp.field_2._8_4_];
              intapetmp.field_2._8_4_ = -iVar17;
              if (0 < iVar17) {
                intapetmp.field_2._8_4_ = iVar17;
              }
              intape.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&result._M_string_length
              ;
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fbb2;
              pbVar29 = (pointer)boost::detail::
                                 lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
                                 convert((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>
                                          *)((long)&intapetmp.field_2 + 8));
              _Var12 = result._M_dataplus;
              if (iVar17 < 0) {
                pbVar29[-1].field_2._M_local_buf[0xf] = '-';
                pbVar29 = (pointer)((long)&pbVar29[-1].field_2._M_allocated_capacity + 0xf);
              }
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar29;
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fbe4;
              std::__cxx11::string::replace
                        ((ulong)&intape.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0,_Var12._M_p,
                         (ulong)pbVar29);
              pbVar29 = intape.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fbfe;
              std::__cxx11::string::_M_append(filename.field_2._M_local_buf + 8,(ulong)pbVar29);
              if (intape.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                  (pointer)&result._M_string_length) {
                pbVar29 = (pointer)CONCAT71(result._M_string_length._1_7_,
                                            (undefined1)result._M_string_length);
                auVar37 = (undefined1  [8])
                          intape.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_0010fddf:
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fde7;
                operator_delete((void *)auVar37,(ulong)((long)&(pbVar29->_M_dataplus)._M_p + 1));
              }
            }
            else {
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f254;
              iVar17 = std::__cxx11::string::compare((char *)auVar37);
              auVar37 = auStack_88;
              if (iVar17 == 0) {
                auStack_58 = (undefined1  [8])ppbVar1;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fc34;
                std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fc43;
                cVar22 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         ::find(local_220,(key_type *)auStack_58);
                auVar37 = auStack_58;
                if (auStack_58 != (undefined1  [8])ppbVar1) {
                  p_Var10 = &(line.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fc5b;
                  operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                }
                if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fc7c;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Write: ",7);
                  pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                  sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fc94;
                  poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,pcVar19,sVar8);
                  uVar6 = *(undefined8 *)(*(long *)poVar27 + -0x18);
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fcab;
                  std::ios::widen((char)uVar6 + (char)poVar27);
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fcb6;
                  std::ostream::put((char)poVar27);
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fcbe;
                  std::ostream::flush();
                }
                pcVar7 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fcd6;
                std::__cxx11::string::_M_append(filename.field_2._M_local_buf + 8,(ulong)pcVar7);
              }
              else {
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f26c;
                iVar17 = std::__cxx11::string::compare((char *)auVar37);
                auVar37 = auStack_88;
                if (iVar17 != 0) {
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f284;
                  iVar17 = std::__cxx11::string::compare((char *)auVar37);
                  auVar37 = auStack_88;
                  if (iVar17 == 0) {
                    auStack_58 = (undefined1  [8])ppbVar1;
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe06;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)auStack_58,"verbose","");
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe15;
                    cVar22 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                             ::find(local_220,(key_type *)auStack_58);
                    auVar37 = auStack_58;
                    if (auStack_58 != (undefined1  [8])ppbVar1) {
                      p_Var10 = &(line.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe2d;
                      operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                    }
                    if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe4e;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"M[",2);
                      pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                      sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe66;
                      poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,pcVar19,sVar8);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe7d;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar27,"] --> Working Memory",0x14);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe85;
                      std::endl<char,std::char_traits<char>>(poVar27);
                    }
                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_88 + 0x20);
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe92;
                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fe9c;
                    bVar14 = error_registers(iVar17,regnumber);
                    if (!bVar14) {
                      pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_88 + 0x20);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10feb1;
                      iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
LAB_00110060:
                      iVar17 = __s[iVar17];
                      goto LAB_00110063;
                    }
                    goto LAB_001113c3;
                  }
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f29c;
                  iVar17 = std::__cxx11::string::compare((char *)auVar37);
                  auVar37 = auStack_88;
                  if (iVar17 == 0) {
                    auStack_58 = (undefined1  [8])ppbVar1;
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fed6;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)auStack_58,"verbose","");
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fee5;
                    cVar22 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                             ::find(local_220,(key_type *)auStack_58);
                    auVar37 = auStack_58;
                    if (auStack_58 != (undefined1  [8])ppbVar1) {
                      p_Var10 = &(line.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fefd;
                      operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                    }
                    if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ff1e;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Value: ",7);
                      pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                      sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ff36;
                      poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,pcVar19,sVar8);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ff4d;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar27," --> Working Memory",0x13);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ff55;
                      std::endl<char,std::char_traits<char>>(poVar27);
                    }
                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_88 + 0x20);
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ff62;
                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                    goto LAB_00110063;
                  }
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f2b4;
                  iVar17 = std::__cxx11::string::compare((char *)auVar37);
                  auVar37 = auStack_88;
                  if (iVar17 == 0) {
                    auStack_58 = (undefined1  [8])ppbVar1;
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ff85;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)auStack_58,"verbose","");
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ff94;
                    cVar22 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                             ::find(local_220,(key_type *)auStack_58);
                    auVar37 = auStack_58;
                    if (auStack_58 != (undefined1  [8])ppbVar1) {
                      p_Var10 = &(line.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ffac;
                      operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                    }
                    if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ffcd;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"M[M[",4);
                      pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                      sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10ffe5;
                      poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,pcVar19,sVar8);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fffc;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar27,"]] --> Working Memory",0x15);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110004;
                      std::endl<char,std::char_traits<char>>(poVar27);
                    }
                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_88 + 0x20);
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110011;
                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11001b;
                    bVar14 = error_registers(iVar17,regnumber);
                    if (!bVar14) {
                      pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_88 + 0x20);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110030;
                      iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                      iVar17 = __s[iVar17];
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110041;
                      bVar14 = error_registers(iVar17,regnumber);
                      if (!bVar14) {
                        pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)auStack_88 + 0x20);
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110056;
                        iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                        iVar17 = __s[iVar17];
                        goto LAB_00110060;
                      }
                    }
                  }
                  else {
                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f2cc;
                    iVar17 = std::__cxx11::string::compare((char *)auVar37);
                    auVar37 = auStack_88;
                    if (iVar17 == 0) {
                      auStack_58 = (undefined1  [8])ppbVar1;
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110084;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)auStack_58,"verbose","");
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110093;
                      cVar22 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                               ::find(local_220,(key_type *)auStack_58);
                      auVar37 = auStack_58;
                      if (auStack_58 != (undefined1  [8])ppbVar1) {
                        p_Var10 = &(line.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1100ab;
                        operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                      }
                      if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1100cc;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Working Memory --> M[",0x15);
                        pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                        sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1100e4;
                        poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,pcVar19,sVar8);
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1100fb;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar27,"]",1);
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110103;
                        std::endl<char,std::char_traits<char>>(poVar27);
                      }
                      pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_88 + 0x20);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110110;
                      iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11011a;
                      bVar14 = error_registers(iVar17,regnumber);
                      if (!bVar14) {
                        iVar17 = *__s;
                        pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)auStack_88 + 0x20);
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110135;
                        iVar18 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
LAB_0011023b:
                        __s[iVar18] = iVar17;
                        goto LAB_0010f971;
                      }
                    }
                    else {
                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f2e4;
                      iVar17 = std::__cxx11::string::compare((char *)auVar37);
                      auVar37 = auStack_88;
                      if (iVar17 == 0) {
                        auStack_58 = (undefined1  [8])ppbVar1;
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11015a;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)auStack_58,"verbose","");
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110169;
                        cVar22 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                 ::find(local_220,(key_type *)auStack_58);
                        auVar37 = auStack_58;
                        if (auStack_58 != (undefined1  [8])ppbVar1) {
                          p_Var10 = &(line.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110181;
                          operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                        }
                        if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1101a2;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Working Memory --> M[M[",0x17);
                          pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                          sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1101ba;
                          poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,pcVar19,sVar8);
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1101d1;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar27,"]]",2);
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1101d9;
                          std::endl<char,std::char_traits<char>>(poVar27);
                        }
                        pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)auStack_88 + 0x20);
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1101e6;
                        iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1101f0;
                        bVar14 = error_registers(iVar17,regnumber);
                        if (!bVar14) {
                          pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)auStack_88 + 0x20);
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110205;
                          iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                          iVar17 = __s[iVar17];
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110216;
                          bVar14 = error_registers(iVar17,regnumber);
                          if (!bVar14) {
                            iVar17 = *__s;
                            pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_88 + 0x20);
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110231;
                            iVar18 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                            iVar18 = __s[iVar18];
                            goto LAB_0011023b;
                          }
                        }
                      }
                      else {
                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f2fc;
                        iVar17 = std::__cxx11::string::compare((char *)auVar37);
                        auVar37 = auStack_88;
                        if (iVar17 == 0) {
                          auStack_58 = (undefined1  [8])ppbVar1;
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11025d;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)auStack_58,"verbose","");
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11026c;
                          cVar22 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                   ::find(local_220,(key_type *)auStack_58);
                          auVar37 = auStack_58;
                          if (auStack_58 !=
                              (undefined1  [8])
                              &line.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish) {
                            p_Var10 = &(line.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110288;
                            operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                          }
                          if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1102a9;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"M[0] + M[",9);
                            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                            sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1102c1;
                            poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,pcVar19,sVar8);
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1102d8;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar27,"] --> M[0]",10);
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1102e0;
                            std::endl<char,std::char_traits<char>>(poVar27);
                          }
                          pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)auStack_88 + 0x20);
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1102ed;
                          iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1102f7;
                          bVar14 = error_registers(iVar17,regnumber);
                          if (!bVar14) {
                            iVar18 = *__s;
                            pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_88 + 0x20);
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110312;
                            iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
LAB_001104d5:
                            iVar18 = iVar18 + __s[iVar17];
LAB_001104d8:
                            *__s = iVar18;
                            goto LAB_0010f971;
                          }
                        }
                        else {
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f314;
                          iVar17 = std::__cxx11::string::compare((char *)auVar37);
                          auVar37 = auStack_88;
                          if (iVar17 == 0) {
                            auStack_58 = (undefined1  [8])ppbVar1;
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110337;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)auStack_58,"verbose","");
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110347;
                            cVar22 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                     ::find(local_220,(key_type *)auStack_58);
                            auVar37 = auStack_58;
                            if (auStack_58 !=
                                (undefined1  [8])
                                &line.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish) {
                              p_Var10 = &(line.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110363;
                              operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                            }
                            if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110384;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"M[0] + ",7);
                              pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                              sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11039c;
                              poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,pcVar19,sVar8);
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1103b3;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar27," --> M[0]",9);
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1103bb;
                              std::endl<char,std::char_traits<char>>(poVar27);
                            }
                            iVar18 = *__s;
                            pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_88 + 0x20);
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1103ce;
                            iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                            iVar17 = iVar17 + iVar18;
                            goto LAB_00110063;
                          }
                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f32c;
                          iVar17 = std::__cxx11::string::compare((char *)auVar37);
                          auVar37 = auStack_88;
                          if (iVar17 == 0) {
                            auStack_58 = (undefined1  [8])ppbVar1;
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1103ef;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)auStack_58,"verbose","");
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1103ff;
                            cVar22 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                     ::find(local_220,(key_type *)auStack_58);
                            auVar37 = auStack_58;
                            if (auStack_58 !=
                                (undefined1  [8])
                                &line.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish) {
                              p_Var10 = &(line.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11041b;
                              operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                            }
                            if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11043c;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"M[0] + M[M[",0xb);
                              pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                              sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110454;
                              poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,pcVar19,sVar8);
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11046b;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar27,"]] --> M[0]",0xb);
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110473;
                              std::endl<char,std::char_traits<char>>(poVar27);
                            }
                            pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_88 + 0x20);
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110480;
                            iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11048a;
                            bVar14 = error_registers(iVar17,regnumber);
                            if (!bVar14) {
                              pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_88 + 0x20);
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11049f;
                              iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                              iVar17 = __s[iVar17];
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1104b0;
                              bVar14 = error_registers(iVar17,regnumber);
                              if (!bVar14) {
                                iVar18 = *__s;
                                pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_88 + 0x20);
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1104cb;
                                iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                iVar17 = __s[iVar17];
                                goto LAB_001104d5;
                              }
                            }
                          }
                          else {
                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f344;
                            iVar17 = std::__cxx11::string::compare((char *)auVar37);
                            auVar37 = auStack_88;
                            if (iVar17 == 0) {
                              auStack_58 = (undefined1  [8])
                                           &line.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1104fe;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)auStack_58,"verbose","");
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11050e;
                              cVar22 = std::
                                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                       ::find(local_220,(key_type *)auStack_58);
                              auVar37 = auStack_58;
                              if (auStack_58 !=
                                  (undefined1  [8])
                                  &line.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish) {
                                p_Var10 = &(line.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus
                                ;
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11052a;
                                operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                              }
                              if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11054b;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"M[0] - M[",9);
                                pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                                sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110563;
                                poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,pcVar19,sVar8);
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11057a;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar27,"] --> M[0]",10);
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110582;
                                std::endl<char,std::char_traits<char>>(poVar27);
                              }
                              pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_88 + 0x20);
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11058f;
                              iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110599;
                              bVar14 = error_registers(iVar17,regnumber);
                              if (!bVar14) {
                                iVar18 = *__s;
                                pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_88 + 0x20);
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1105b4;
                                iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
LAB_00110787:
                                iVar18 = iVar18 - __s[iVar17];
                                goto LAB_001104d8;
                              }
                            }
                            else {
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f35c;
                              iVar17 = std::__cxx11::string::compare((char *)auVar37);
                              auVar37 = auStack_88;
                              if (iVar17 == 0) {
                                auStack_58 = (undefined1  [8])
                                             &line.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1105de;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)auStack_58,"verbose","");
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1105ee;
                                cVar22 = std::
                                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                         ::find(local_220,(key_type *)auStack_58);
                                auVar37 = auStack_58;
                                if (auStack_58 !=
                                    (undefined1  [8])
                                    &line.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish) {
                                  p_Var10 = &(line.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_dataplus;
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11060a;
                                  operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1))
                                  ;
                                }
                                if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11062b;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"M[0] - ",7);
                                  pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p
                                  ;
                                  sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110643;
                                  poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,pcVar19,sVar8);
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11065a;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar27," --> M[0]",9);
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110662;
                                  std::endl<char,std::char_traits<char>>(poVar27);
                                }
                                iVar17 = *__s;
                                pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_88 + 0x20);
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110675;
                                iVar18 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                *__s = iVar17 - iVar18;
                                goto LAB_0010f971;
                              }
                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f374;
                              iVar17 = std::__cxx11::string::compare((char *)auVar37);
                              auVar37 = auStack_88;
                              if (iVar17 == 0) {
                                auStack_58 = (undefined1  [8])
                                             &line.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1106a1;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)auStack_58,"verbose","");
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1106b1;
                                cVar22 = std::
                                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                         ::find(local_220,(key_type *)auStack_58);
                                auVar37 = auStack_58;
                                if (auStack_58 !=
                                    (undefined1  [8])
                                    &line.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish) {
                                  p_Var10 = &(line.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_dataplus;
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1106cd;
                                  operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1))
                                  ;
                                }
                                if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1106ee;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"M[0] - M[M[",0xb);
                                  pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p
                                  ;
                                  sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110706;
                                  poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,pcVar19,sVar8);
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11071d;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar27,"]] --> M[0]",0xb);
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110725;
                                  std::endl<char,std::char_traits<char>>(poVar27);
                                }
                                pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_88 + 0x20);
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110732;
                                iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11073c;
                                bVar14 = error_registers(iVar17,regnumber);
                                if (!bVar14) {
                                  pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)auStack_88 + 0x20);
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110751;
                                  iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                  iVar17 = __s[iVar17];
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110762;
                                  bVar14 = error_registers(iVar17,regnumber);
                                  if (!bVar14) {
                                    iVar18 = *__s;
                                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_88 + 0x20);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11077d;
                                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                    iVar17 = __s[iVar17];
                                    goto LAB_00110787;
                                  }
                                }
                              }
                              else {
                                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f38c;
                                iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                auVar37 = auStack_88;
                                if (iVar17 == 0) {
                                  auStack_58 = (undefined1  [8])
                                               &line.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish;
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1107ae;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)auStack_58,"verbose","");
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1107be;
                                  cVar22 = std::
                                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                           ::find(local_220,(key_type *)auStack_58);
                                  auVar37 = auStack_58;
                                  if (auStack_58 !=
                                      (undefined1  [8])
                                      &line.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish) {
                                    p_Var10 = &(line.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->
                                               _M_dataplus;
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1107da;
                                    operator_delete((void *)auVar37,
                                                    (ulong)((long)&p_Var10->_M_p + 1));
                                  }
                                  if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1107fb;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"M[0] * M[",9);
                                    pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus).
                                              _M_p;
                                    sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110813;
                                    poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,pcVar19,sVar8);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11082a;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar27,"] --> M[0]",10);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110832;
                                    std::endl<char,std::char_traits<char>>(poVar27);
                                  }
                                  pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)auStack_88 + 0x20);
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11083f;
                                  iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110849;
                                  bVar14 = error_registers(iVar17,regnumber);
                                  if (!bVar14) {
                                    iVar18 = *__s;
                                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_88 + 0x20);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110864;
                                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
LAB_00110a32:
                                    iVar18 = iVar18 * __s[iVar17];
                                    goto LAB_001104d8;
                                  }
                                }
                                else {
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f3a4;
                                  iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                  auVar37 = auStack_88;
                                  if (iVar17 == 0) {
                                    auStack_58 = (undefined1  [8])
                                                 &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11088e;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)auStack_58,"verbose","");
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11089e;
                                    cVar22 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                             ::find(local_220,(key_type *)auStack_58);
                                    auVar37 = auStack_58;
                                    if (auStack_58 !=
                                        (undefined1  [8])
                                        &line.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish) {
                                      p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                 _M_dataplus;
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1108ba;
                                      operator_delete((void *)auVar37,
                                                      (ulong)((long)&p_Var10->_M_p + 1));
                                    }
                                    if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1108db;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"M[0] * ",7);
                                      pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus).
                                                _M_p;
                                      sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length
                                      ;
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1108f3;
                                      poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,pcVar19,sVar8);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11090a;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar27," --> M[0]",9);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110912;
                                      std::endl<char,std::char_traits<char>>(poVar27);
                                    }
                                    iVar18 = *__s;
                                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_88 + 0x20);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110925;
                                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                    iVar17 = iVar17 * iVar18;
LAB_00110063:
                                    *__s = iVar17;
                                    goto LAB_0010f971;
                                  }
                                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f3bc;
                                  iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                  auVar37 = auStack_88;
                                  if (iVar17 == 0) {
                                    auStack_58 = (undefined1  [8])
                                                 &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11094c;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)auStack_58,"verbose","");
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11095c;
                                    cVar22 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                             ::find(local_220,(key_type *)auStack_58);
                                    auVar37 = auStack_58;
                                    if (auStack_58 !=
                                        (undefined1  [8])
                                        &line.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish) {
                                      p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                 _M_dataplus;
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110978;
                                      operator_delete((void *)auVar37,
                                                      (ulong)((long)&p_Var10->_M_p + 1));
                                    }
                                    if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110999;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"M[0] * M[M[",0xb);
                                      pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus).
                                                _M_p;
                                      sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length
                                      ;
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1109b1;
                                      poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,pcVar19,sVar8);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1109c8;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar27,"]] --> M[0]",0xb);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1109d0;
                                      std::endl<char,std::char_traits<char>>(poVar27);
                                    }
                                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_88 + 0x20);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1109dd;
                                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1109e7;
                                    bVar14 = error_registers(iVar17,regnumber);
                                    if (!bVar14) {
                                      pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)auStack_88 + 0x20);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1109fc;
                                      iVar17 = boost::lexical_cast<int,std::__cxx11::string>
                                                         (pbVar36);
                                      iVar17 = __s[iVar17];
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110a0d;
                                      bVar14 = error_registers(iVar17,regnumber);
                                      if (!bVar14) {
                                        iVar18 = *__s;
                                        pbVar36 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)auStack_88 + 0x20);
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110a28;
                                        iVar17 = boost::lexical_cast<int,std::__cxx11::string>
                                                           (pbVar36);
                                        iVar17 = __s[iVar17];
                                        goto LAB_00110a32;
                                      }
                                    }
                                  }
                                  else {
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f3d4;
                                    iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                    auVar37 = auStack_88;
                                    if (iVar17 != 0) {
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f3ec;
                                      iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                      auVar37 = auStack_88;
                                      if (iVar17 == 0) {
                                        auStack_58 = (undefined1  [8])
                                                     &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110b3e;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)auStack_58,"verbose","");
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110b4e;
                                        cVar22 = std::
                                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                 ::find(local_220,(key_type *)auStack_58);
                                        auVar37 = auStack_58;
                                        if (auStack_58 !=
                                            (undefined1  [8])
                                            &line.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish) {
                                          p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110b6a;
                                          operator_delete((void *)auVar37,
                                                          (ulong)((long)&p_Var10->_M_p + 1));
                                        }
                                        if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110b8b;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"M[0] / ",7);
                                          pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                    _M_dataplus)._M_p;
                                          sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                  _M_string_length;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110ba3;
                                          poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,pcVar19,sVar8);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110bba;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar27," --> M[0]",9);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110bc2;
                                          std::endl<char,std::char_traits<char>>(poVar27);
                                        }
                                        iVar17 = *__s;
                                        pbVar36 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)auStack_88 + 0x20);
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110bd5;
                                        iVar18 = boost::lexical_cast<int,std::__cxx11::string>
                                                           (pbVar36);
                                        iVar17 = iVar17 / iVar18;
                                        goto LAB_00110063;
                                      }
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f404;
                                      iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                      auVar37 = auStack_88;
                                      if (iVar17 == 0) {
                                        auStack_58 = (undefined1  [8])
                                                     &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110cea;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)auStack_58,"verbose","");
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110cfa;
                                        cVar22 = std::
                                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                 ::find(local_220,(key_type *)auStack_58);
                                        auVar37 = auStack_58;
                                        if (auStack_58 !=
                                            (undefined1  [8])
                                            &line.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish) {
                                          p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d16;
                                          operator_delete((void *)auVar37,
                                                          (ulong)((long)&p_Var10->_M_p + 1));
                                        }
                                        if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d37;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"M[0] / M[M[",0xb);
                                          pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                    _M_dataplus)._M_p;
                                          sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                  _M_string_length;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d4f;
                                          poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,pcVar19,sVar8);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d66;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar27,"]] --> M[0]",0xb);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d6e;
                                          std::endl<char,std::char_traits<char>>(poVar27);
                                        }
                                        pbVar36 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)auStack_88 + 0x20);
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d7b;
                                        iVar17 = boost::lexical_cast<int,std::__cxx11::string>
                                                           (pbVar36);
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d85;
                                        bVar14 = error_registers(iVar17,regnumber);
                                        if (!bVar14) {
                                          pbVar36 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)auStack_88 + 0x20);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110d9a;
                                          iVar17 = boost::lexical_cast<int,std::__cxx11::string>
                                                             (pbVar36);
                                          iVar17 = __s[iVar17];
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110dab;
                                          bVar14 = error_registers(iVar17,regnumber);
                                          if (!bVar14) {
                                            iVar17 = *__s;
                                            pbVar36 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)auStack_88 + 0x20);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110dc6;
                                            iVar18 = boost::lexical_cast<int,std::__cxx11::string>
                                                               (pbVar36);
                                            iVar18 = __s[iVar18];
                                            goto LAB_00110dd3;
                                          }
                                        }
                                        goto LAB_001113c3;
                                      }
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f41c;
                                      iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                      auVar37 = auStack_88;
                                      if (iVar17 == 0) {
LAB_00110be1:
                                        auStack_58 = (undefined1  [8])
                                                     &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c00;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)auStack_58,"verbose","");
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c10;
                                        cVar22 = std::
                                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                 ::find(local_220,(key_type *)auStack_58);
                                        auVar37 = auStack_58;
                                        if (auStack_58 !=
                                            (undefined1  [8])
                                            &line.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish) {
                                          p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c2c;
                                          operator_delete((void *)auVar37,
                                                          (ulong)((long)&p_Var10->_M_p + 1));
                                        }
                                        if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c4d;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"Jump to LABEL \'",0xf);
                                          pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                    _M_dataplus)._M_p;
                                          sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                  _M_string_length;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c65;
                                          poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,pcVar19,sVar8);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c7c;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar27,"\'",1);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c84;
                                          std::endl<char,std::char_traits<char>>(poVar27);
                                        }
                                        pkVar33 = (key_type *)((long)auStack_88 + 0x20);
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110c98;
                                        pmVar28 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)((long)&fetch.field_2 + 8),pkVar33);
                                        if (*pmVar28 != 0) {
LAB_00110ca1:
                                          pkVar33 = (key_type *)((long)auStack_88 + 0x20);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110cb5;
                                          p_Var30 = (_Ios_Seekdir *)
                                                    std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)((long)&fetch.field_2 + 8),pkVar33);
                                          _Var5 = *p_Var30;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110cc6;
                                          std::istream::seekg((long)local_490,_Var5);
                                          goto LAB_0010f971;
                                        }
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1113ef;
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cerr,"<!> Label \'",0xb);
                                        pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus
                                                  )._M_p;
                                        sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                _M_string_length;
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111407;
                                        poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cerr,pcVar19,sVar8);
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11141e;
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar27,"\' not found.",0xc);
                                      }
                                      else {
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f434;
                                        iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                        auVar37 = auStack_88;
                                        if (iVar17 == 0) goto LAB_00110be1;
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f44c;
                                        iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                        auVar37 = auStack_88;
                                        if (iVar17 == 0) {
                                          if (*__s != 0) {
                                            auStack_58 = (undefined1  [8])
                                                         &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110e09;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)auStack_58,"verbose","");
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110e19;
                                            cVar22 = std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                  ::find(local_220,(key_type *)auStack_58);
                                            auVar37 = auStack_58;
                                            if (auStack_58 !=
                                                (undefined1  [8])
                                                &line.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish) {
                                              p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110e35;
                                              operator_delete((void *)auVar37,
                                                              (ulong)((long)&p_Var10->_M_p + 1));
                                            }
                                            lVar31 = 0x16;
                                            pcVar19 = "Can\'t jump: M[0] != 0 ";
LAB_001110d8:
                                            if (cVar22._M_node == (_Base_ptr)result.field_2._8_8_)
                                            goto LAB_0010f971;
                                            poVar27 = (ostream *)&std::cout;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1110f4;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,pcVar19,lVar31);
LAB_001110f4:
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1110fc;
                                            std::endl<char,std::char_traits<char>>(poVar27);
                                            goto LAB_0010f971;
                                          }
                                          auStack_58 = (undefined1  [8])
                                                       &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110fdb;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)auStack_58,"verbose","");
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110feb;
                                          cVar22 = std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                  ::find(local_220,(key_type *)auStack_58);
                                          auVar37 = auStack_58;
                                          if (auStack_58 !=
                                              (undefined1  [8])
                                              &line.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish) {
                                            p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111007;
                                            operator_delete((void *)auVar37,
                                                            (ulong)((long)&p_Var10->_M_p + 1));
                                          }
                                          if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111028;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,"Jump to LABEL \'",0xf)
                                            ;
                                            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                      _M_dataplus)._M_p;
                                            sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                    _M_string_length;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111040;
                                            poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,pcVar19,sVar8);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111057;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar27,"\'",1);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11105f;
                                            std::endl<char,std::char_traits<char>>(poVar27);
                                          }
                                          pkVar33 = (key_type *)((long)auStack_88 + 0x20);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111073;
                                          pmVar28 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)((long)&fetch.field_2 + 8),pkVar33);
                                          if (*pmVar28 == 0) {
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111674;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cerr,"<!> Label \'",0xb);
                                            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                      _M_dataplus)._M_p;
                                            sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                    _M_string_length;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11168c;
                                            poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cerr,pcVar19,sVar8);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1116a3;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar27,"\' not found.",0xc);
                                            goto LAB_001113bb;
                                          }
                                          goto LAB_00110ca1;
                                        }
                                        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f464;
                                        iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                        auVar37 = auStack_88;
                                        if (iVar17 == 0) {
                                          if (*__s < 1) {
                                            auStack_58 = (undefined1  [8])
                                                         &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1110a0;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)auStack_58,"verbose","");
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1110b0;
                                            cVar22 = std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                  ::find(local_220,(key_type *)auStack_58);
                                            auVar37 = auStack_58;
                                            if (auStack_58 !=
                                                (undefined1  [8])
                                                &line.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish) {
                                              p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1110cc;
                                              operator_delete((void *)auVar37,
                                                              (ulong)((long)&p_Var10->_M_p + 1));
                                            }
                                            lVar31 = 0x15;
                                            pcVar19 = "Can\'t jump: M[0] < 0 ";
                                            goto LAB_001110d8;
                                          }
                                          auStack_58 = (undefined1  [8])
                                                       &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110e72;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)auStack_58,"verbose","");
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110e82;
                                          cVar22 = std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                  ::find(local_220,(key_type *)auStack_58);
                                          auVar37 = auStack_58;
                                          if (auStack_58 !=
                                              (undefined1  [8])
                                              &line.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish) {
                                            p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110e9e;
                                            operator_delete((void *)auVar37,
                                                            (ulong)((long)&p_Var10->_M_p + 1));
                                          }
                                          if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110ebf;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,"Jump to LABEL \'",0xf)
                                            ;
                                            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                      _M_dataplus)._M_p;
                                            sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                    _M_string_length;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110ed7;
                                            poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,pcVar19,sVar8);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110eee;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar27,"\'",1);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110ef6;
                                            std::endl<char,std::char_traits<char>>(poVar27);
                                          }
                                          pkVar33 = (key_type *)((long)auStack_88 + 0x20);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110f0a;
                                          pmVar28 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)((long)&fetch.field_2 + 8),pkVar33);
                                          if (*pmVar28 != 0) goto LAB_00110ca1;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111628;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cerr,"<!> Label \'",0xb);
                                          pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                    _M_dataplus)._M_p;
                                          sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                  _M_string_length;
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111640;
                                          poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cerr,pcVar19,sVar8);
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111657;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar27,"\' not found.",0xc);
                                        }
                                        else {
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f47c;
                                          iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                          auVar37 = auStack_88;
                                          if (iVar17 == 0) {
                                            auStack_58 = (undefined1  [8])
                                                         &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110f37;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)auStack_58,"verbose","");
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110f47;
                                            cVar22 = std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                  ::find(local_220,(key_type *)auStack_58);
                                            auVar37 = auStack_58;
                                            if (auStack_58 !=
                                                (undefined1  [8])
                                                &line.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish) {
                                              p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110f63;
                                              operator_delete((void *)auVar37,
                                                              (ulong)((long)&p_Var10->_M_p + 1));
                                            }
                                            if (cVar22._M_node == (_Base_ptr)result.field_2._8_8_)
                                            goto LAB_0010f971;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110f88;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,"Found LABEL \'",0xd);
                                            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                      _M_dataplus)._M_p;
                                            sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                    _M_string_length;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110fa0;
                                            poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,pcVar19,sVar8);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110fb7;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar27,"\'",1);
                                            goto LAB_001110f4;
                                          }
                                          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f494;
                                          iVar17 = std::__cxx11::string::compare((char *)auVar37);
                                          if (iVar17 == 0) {
                                            auStack_58 = (undefined1  [8])
                                                         &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f4bb;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)auStack_58,"verbose","");
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f4cb;
                                            cVar22 = std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                                  ::find(local_220,(key_type *)auStack_58);
                                            auVar37 = auStack_58;
                                            if (auStack_58 !=
                                                (undefined1  [8])
                                                &line.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish) {
                                              p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_dataplus;
                                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f4e7;
                                              operator_delete((void *)auVar37,
                                                              (ulong)((long)&p_Var10->_M_p + 1));
                                            }
                                            if (cVar22._M_node == (_Base_ptr)result.field_2._8_8_) {
                                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111596;
                                              std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)auStack_88);
                                              goto LAB_001111ae;
                                            }
                                            pbVar36 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)auStack_88 + 0x20);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f501;
                                            iVar17 = boost::lexical_cast<int,std::__cxx11::string>
                                                               (pbVar36);
                                            if (iVar17 == 1) {
                                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f522;
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"Registers dump: ",
                                                         0x10);
                                              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f52e;
                                              std::endl<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout);
                                              if (0 < (int)regnumber) {
                                                uVar38 = 0;
                                                do {
                                                  *(undefined8 *)((long)&uStack_550 + lVar9) =
                                                       0x10f553;
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,"         M[",0xb
                                                            );
                                                  *(undefined8 *)((long)&uStack_550 + lVar9) =
                                                       0x10f562;
                                                  poVar27 = (ostream *)
                                                            std::ostream::operator<<
                                                                      ((ostream *)&std::cout,
                                                                       (int)uVar38);
                                                  *(undefined8 *)((long)&uStack_550 + lVar9) =
                                                       0x10f579;
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar27,"] = ",4);
                                                  iVar17 = __s[uVar38];
                                                  *(undefined8 *)((long)&uStack_550 + lVar9) =
                                                       0x10f589;
                                                  poVar27 = (ostream *)
                                                            std::ostream::operator<<
                                                                      ((ostream *)poVar27,iVar17);
                                                  *(undefined8 *)((long)&uStack_550 + lVar9) =
                                                       0x10f591;
                                                  std::endl<char,std::char_traits<char>>(poVar27);
                                                  uVar38 = uVar38 + 1;
                                                } while (local_238 != uVar38);
                                              }
                                              goto LAB_0010f971;
                                            }
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1115b3;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cerr,
                                                       "<!> Invalid debug option \'",0x1a);
                                            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->
                                                      _M_dataplus)._M_p;
                                            sVar8 = ((pointer)((long)auStack_88 + 0x20))->
                                                    _M_string_length;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1115cb;
                                            poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cerr,pcVar19,sVar8);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1115e2;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar27,"\'",1);
                                          }
                                          else {
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111557;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cerr,"<!> Syntax error \'",
                                                       0x12);
                                            _Var12 = fetch._M_dataplus;
                                            uVar6 = outtape.field_2._8_8_;
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111571;
                                            poVar27 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cerr,(char *)uVar6,
                                                             (long)_Var12._M_p);
                                            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111588;
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar27,"\'",1);
                                          }
                                        }
                                      }
LAB_001113bb:
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1113c3;
                                      std::endl<char,std::char_traits<char>>(poVar27);
                                      goto LAB_001113c3;
                                    }
                                    auStack_58 = (undefined1  [8])
                                                 &line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110a5a;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)auStack_58,"verbose","");
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110a6a;
                                    cVar22 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                             ::find(local_220,(key_type *)auStack_58);
                                    auVar37 = auStack_58;
                                    if (auStack_58 !=
                                        (undefined1  [8])
                                        &line.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish) {
                                      p_Var10 = &(line.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                 _M_dataplus;
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110a86;
                                      operator_delete((void *)auVar37,
                                                      (ulong)((long)&p_Var10->_M_p + 1));
                                    }
                                    if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110aa7;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"M[0] / M[",9);
                                      pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus).
                                                _M_p;
                                      sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length
                                      ;
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110abf;
                                      poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,pcVar19,sVar8);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110ad6;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar27,"] --> M[0]",10);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110ade;
                                      std::endl<char,std::char_traits<char>>(poVar27);
                                    }
                                    pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_88 + 0x20);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110aeb;
                                    iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                                    *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110af5;
                                    bVar14 = error_registers(iVar17,regnumber);
                                    if (!bVar14) {
                                      iVar17 = *__s;
                                      pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)auStack_88 + 0x20);
                                      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x110b10;
                                      iVar18 = boost::lexical_cast<int,std::__cxx11::string>
                                                         (pbVar36);
LAB_00110dd3:
                                      *__s = iVar17 / __s[iVar18];
                                      goto LAB_0010f971;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_001113c3;
                }
                auStack_58 = (undefined1  [8])ppbVar1;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fcf5;
                std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd04;
                cVar22 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         ::find(local_220,(key_type *)auStack_58);
                auVar37 = auStack_58;
                if (auStack_58 != (undefined1  [8])ppbVar1) {
                  p_Var10 = &(line.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd1c;
                  operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
                }
                if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd3d;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Write: M[M[",0xb);
                  pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
                  sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd55;
                  poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,pcVar19,sVar8);
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd6c;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar27,"]] = ",5);
                  pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)auStack_88 + 0x20);
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd79;
                  iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                  iVar17 = __s[__s[iVar17]];
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd8e;
                  poVar27 = (ostream *)std::ostream::operator<<((ostream *)poVar27,iVar17);
                  *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fd96;
                  std::endl<char,std::char_traits<char>>(poVar27);
                }
                pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_88 + 0x20);
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fda3;
                iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
                iVar17 = __s[iVar17];
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fdba;
                boost::lexical_cast<std::__cxx11::string,int>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_58,(boost *)(__s + iVar17),arg);
                auVar37 = auStack_58;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10fdce;
                std::__cxx11::string::_M_append(filename.field_2._M_local_buf + 8,(ulong)auVar37);
                pbVar29 = line.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                auVar37 = auStack_58;
                if (auStack_58 != (undefined1  [8])ppbVar1) goto LAB_0010fddf;
              }
            }
LAB_0010f971:
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f97a;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_88);
            puVar35 = local_490 + *(long *)((long)local_490 + -0x18);
            bVar4 = abStack_470[*(long *)((long)local_490 + -0x18)];
            goto joined_r0x0010f9a2;
          }
          auStack_58 = (undefined1  [8])ppbVar1;
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f7a7;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"verbose","");
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f7b6;
          cVar22 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   ::find(local_220,(key_type *)auStack_58);
          auVar37 = auStack_58;
          if (auStack_58 != (undefined1  [8])ppbVar1) {
            p_Var10 = &(line.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f7ce;
            operator_delete((void *)auVar37,(ulong)((long)&p_Var10->_M_p + 1));
          }
          uVar38 = (ulong)iVar15;
          if (cVar22._M_node != (_Base_ptr)result.field_2._8_8_) {
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f7f6;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read: ",6);
            pcVar19 = *(char **)(know_label._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                uVar38 * 0x20);
            lVar31 = *(long *)(know_label._M_t._M_impl.super__Rb_tree_header._M_node_count + 8 +
                              uVar38 * 0x20);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f819;
            poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar19,lVar31);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f830;
            std::__ostream_insert<char,std::char_traits<char>>(poVar27," --> M[M[",9);
            pcVar19 = (((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
            sVar8 = ((pointer)((long)auStack_88 + 0x20))->_M_string_length;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f844;
            poVar27 = std::__ostream_insert<char,std::char_traits<char>>(poVar27,pcVar19,sVar8);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f85b;
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,"]]",2);
            uVar6 = *(undefined8 *)(*(long *)poVar27 + -0x18);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f86f;
            std::ios::widen((char)uVar6 + (char)poVar27);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f87a;
            std::ostream::put((char)poVar27);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f882;
            std::ostream::flush();
          }
          intape.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)intape.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffff00000000);
          auStack_58 = (undefined1  [8])(((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
          line.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                        ((pointer)((long)auStack_88 + 0x20))->_M_string_length);
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f8b3;
          bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                   shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)
                                   auStack_58,
                                   (int *)&intape.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar14) {
            auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1114c4;
            boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
          }
          iVar17 = (int)intape.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f8c9;
          bVar14 = error_registers(iVar17,regnumber);
          if (!bVar14) {
            intape.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)intape.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffff00000000);
            auStack_58 = (undefined1  [8])(((pointer)((long)auStack_88 + 0x20))->_M_dataplus)._M_p;
            line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)&(((pointer)auStack_58)->_M_dataplus)._M_p +
                          ((pointer)((long)auStack_88 + 0x20))->_M_string_length);
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f902;
            bVar14 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                     shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)
                                     auStack_58,
                                     (int *)&intape.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (!bVar14) {
              auStack_58 = (undefined1  [8])&PTR__bad_cast_0011ed38;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::__cxx11::string::typeinfo;
              line.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&int::typeinfo;
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1114ed;
              boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)auStack_58);
            }
            iVar17 = __s[(int)intape.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage];
            *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f920;
            bVar14 = error_registers(iVar17,regnumber);
            if (!bVar14) {
              if ((ulong)((long)((long)intape.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start -
                                know_label._M_t._M_impl.super__Rb_tree_header._M_node_count) >> 5)
                  <= uVar38) {
                poVar27 = (ostream *)&std::cerr;
                *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1113bb;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"<!> The input tape is finished.",0x1f);
                goto LAB_001113bb;
              }
              pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (know_label._M_t._M_impl.super__Rb_tree_header._M_node_count + uVar38 * 0x20
                        );
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f952;
              iVar17 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
              pbVar36 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_88 + 0x20);
              *(undefined8 *)((long)&uStack_550 + lVar9) = 0x10f961;
              iVar18 = boost::lexical_cast<int,std::__cxx11::string>(pbVar36);
              iVar18 = __s[iVar18];
              goto LAB_0010f96b;
            }
          }
        }
LAB_001113c3:
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1113cc;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_88);
        iVar15 = 1;
        goto LAB_001111bd;
      }
LAB_001111ae:
      iVar15 = 0;
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1111bd;
      std::ifstream::close();
LAB_001111bd:
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1111c9;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)((long)&fetch.field_2 + 8));
      uVar6 = outtape.field_2._8_8_;
      if ((size_type *)outtape.field_2._8_8_ != &fetch._M_string_length) {
        lVar31 = CONCAT71(fetch._M_string_length._1_7_,(undefined1)fetch._M_string_length);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1111eb;
        operator_delete((void *)uVar6,lVar31 + 1);
      }
      *(undefined8 *)((long)&uStack_550 + lVar9) = 0x1111f7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&know_label._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uVar6 = filename.field_2._8_8_;
      if ((size_type *)filename.field_2._8_8_ != &outtape._M_string_length) {
        lVar31 = CONCAT71(outtape._M_string_length._1_7_,(undefined1)outtape._M_string_length);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x111219;
        operator_delete((void *)uVar6,lVar31 + 1);
      }
      auVar37 = local_190;
      pplVar32 = (long **)local_240;
      if (local_190 != (undefined1  [8])&intapetmp._M_string_length) {
        lVar31 = CONCAT71(intapetmp._M_string_length._1_7_,(undefined1)intapetmp._M_string_length);
        *(undefined8 *)((long)&uStack_550 + lVar9) = 0x11123b;
        operator_delete((void *)auVar37,lVar31 + 1);
        pplVar32 = (long **)local_240;
      }
    }
    *(undefined8 *)((long)pplVar32 + -8) = 0x11124e;
    std::ifstream::~ifstream(local_490);
    psVar11 = local_158;
    if (local_158 != &filename._M_string_length) {
      *(undefined8 *)((long)pplVar32 + -8) = 0x111270;
      operator_delete(psVar11,filename._M_string_length + 1);
    }
  }
  else {
    uStack_550 = 0x10ea3b;
    plVar23 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)&local_548);
    uStack_550 = 0x10ea52;
    std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
    uStack_550 = 0x10ea5d;
    std::ostream::put((char)plVar23);
    iVar15 = 1;
    uStack_550 = 0x10ea6b;
    std::ostream::flush();
  }
  local_230 = std::ios::clear;
  *(undefined8 *)((long)pplVar32 + -8) = 0x11128b;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c0);
  *(undefined8 *)((long)pplVar32 + -8) = 0x111297;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_1f0);
  *(undefined8 *)((long)pplVar32 + -8) = 0x1112a3;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_220);
  if (local_4b0 != local_4a0) {
    *(undefined8 *)((long)pplVar32 + -8) = 0x1112c2;
    operator_delete(local_4b0,local_4a0[0] + 1);
  }
  *(undefined8 *)((long)pplVar32 + -8) = 0x1112ce;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4c8);
  *(undefined8 *)((long)pplVar32 + -8) = 0x1112dd;
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_4e0);
  if (local_508 != (void *)0x0) {
    *(undefined8 *)((long)pplVar32 + -8) = 0x1112f5;
    operator_delete(local_508,local_4e8 - (long)local_508);
    local_508 = (void *)0x0;
    local_500 = 0;
    local_4f8 = 0;
    local_4f0 = 0;
    local_4e8 = 0;
  }
  *(undefined8 *)((long)pplVar32 + -8) = 0x111327;
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_520);
  if (local_548 != local_538) {
    *(undefined8 *)((long)pplVar32 + -8) = 0x111346;
    operator_delete(local_548,local_538[0] + 1);
  }
  return iVar15;
}

Assistant:

int main(int argc, char **argv) {
    options_description desc("SimRam - RAM Emulator");
    desc.add_options()
    ("help,h", "prints this")
    ("verbose,v", "enable verbose mode")
    ("registers,r", value<int>(), "set max number of virtual registers")
    ("input,i", value<string>(), "input file")
    ;

    positional_options_description p;
    p.add("input", -1);

    variables_map vm;
    store(command_line_parser(argc, argv).
          options(desc).positional(p).run(), vm);

    notify(vm);

    if(vm.count("help"))
    {
        cout << desc << endl;
        return 1;
    }
    
    int regnumber;
    
    if(vm.count("reg"))
    {
        regnumber = vm["reg"].as<int>();
        if(vm.count("verbose")) cout << "The number of virtual registers was set to " << regnumber << endl;
    } else
    {
        regnumber = REGNUMBER;
    }

    string filename = "input.ram";

    if(vm.count("input"))
    {
        filename = vm["input"].as<string>();
        if(vm.count("verbose")) cout << "The source code was set to '" << filename << "'" << endl;
    }

    ifstream source_file (filename.c_str());

    if (!source_file.is_open())
    {
        cout << "<!> Unable to open file" << endl;
        return EXIT_FAILURE;
    }

    int registers[regnumber];

    memset(registers,0,sizeof(int)*regnumber);

    int inpointer = 0;

    string intapetmp;
    string outtape;
    vector<string> intape;
    
    cout << "Insert input tape (use comma for insert new value): ";
    cin >> intapetmp;
    
    boost::algorithm::split(intape, intapetmp, boost::algorithm::is_any_of(","));
    
    if(vm.count("verbose")) cout<<"There are " << intape.size() <<" values in the tape." << endl;

    string fetch;

    // TODO search LABEL.

    map<string, int> know_label;

    while(!source_file.eof())
    {
        getline(source_file, fetch);

        if(fetch == "halt" || fetch[0] == '#') continue;

        vector<string> line;
        boost::algorithm::split(line, fetch, boost::algorithm::is_any_of(" "));

        if(line[0] == "label") know_label[line[1]] = source_file.tellg();
    }

    source_file.clear();
    source_file.seekg(0, ios::beg);

    while(!source_file.eof())
    {
        // Fetch

        getline(source_file, fetch);

        if(fetch == "halt")
        {
            cout<<"Completed execution with output: "<<outtape<<endl;
            source_file.close();
            return EXIT_SUCCESS;
        } else if(fetch == "" || fetch[0] == '#')
        {
            continue;
        }

        vector<string> line;
        boost::algorithm::split(line, fetch, boost::algorithm::is_any_of(" "));

        // Decode / Execute

        // TODO remove pointer overflow on registers
	// TODO usa una hashmap con comando --> puntatore funzione per migliorare esecuzione.

        if(line[0] == "read")
        {
            if(vm.count("verbose")) cout<<"Read: "<<intape[inpointer]<<" --> M["<<line[1]<<"]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(inpointer >= intape.size())
            {
                cerr << "<!> The input tape is finished." << endl;
                return EXIT_FAILURE;
            }
            registers[boost::lexical_cast<int>(line[1])] = boost::lexical_cast<int>(intape[inpointer]);
            inpointer++;

        } else if(line[0] == "read*")
        {
            if(vm.count("verbose")) cout<<"Read: "<<intape[inpointer]<<" --> M[M["<<line[1]<<"]]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            if(inpointer >= intape.size())
            {
                cerr<<"<!> The input tape is finished."<<endl;
                return EXIT_FAILURE;
            }
            registers[registers[boost::lexical_cast<int>(line[1])]] = boost::lexical_cast<int>(intape[inpointer]);
            inpointer++;

        } else if(line[0] == "write")
        {
            if(vm.count("verbose")) cout<<"Write: M["<<line[1]<<"] = "<<registers[boost::lexical_cast<int>(line[1])]<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            outtape += boost::lexical_cast<string>(registers[boost::lexical_cast<int>(line[1])]);

        } else if(line[0] == "write=")
        {
            if(vm.count("verbose")) cout<<"Write: "<<line[1]<<endl;
            outtape += line[1];

        } else if(line[0] == "write*")
        {
            if(vm.count("verbose")) cout<<"Write: M[M["<<line[1]<<"]] = "<<registers[registers[boost::lexical_cast<int>(line[1])]]<<endl;
            outtape += boost::lexical_cast<string>(registers[registers[boost::lexical_cast<int>(line[1])]]);

        } else if(line[0] == "load")
        {
            if(vm.count("verbose")) cout<<"M["<<line[1]<<"] --> Working Memory"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "load=")
        {
            if(vm.count("verbose")) cout<<"Value: "<<line[1]<<" --> Working Memory"<<endl;
            registers[0] = boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "load*")
        {
            if(vm.count("verbose")) cout<<"M[M["<<line[1]<<"]] --> Working Memory"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "store")
        {
            if(vm.count("verbose")) cout<<"Working Memory --> M["<<line[1]<<"]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[boost::lexical_cast<int>(line[1])] = registers[0];

        } else if(line[0] == "store*")
        {
            if(vm.count("verbose")) cout<<"Working Memory --> M[M["<<line[1]<<"]]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[registers[boost::lexical_cast<int>(line[1])]] = registers[0];

        } else if(line[0] == "add")
        {
            if(vm.count("verbose")) cout<<"M[0] + M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] + registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "add=")
        {
            if(vm.count("verbose")) cout<<"M[0] + "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] + boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "add*")
        {
            if(vm.count("verbose")) cout<<"M[0] + M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] + registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "sub")
        {
            if(vm.count("verbose")) cout<<"M[0] - M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] - registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "sub=")
        {
            if(vm.count("verbose")) cout<<"M[0] - "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] - boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "sub*")
        {
            if(vm.count("verbose")) cout<<"M[0] - M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] - registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "mul")
        {
            if(vm.count("verbose")) cout<<"M[0] * M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] * registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "mul=")
        {
            if(vm.count("verbose")) cout<<"M[0] * "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] * boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "mul*")
        {
            if(vm.count("verbose")) cout<<"M[0] * M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] * registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "div")
        {
            if(vm.count("verbose")) cout<<"M[0] / M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] / registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "div=")
        {
            if(vm.count("verbose")) cout<<"M[0] / "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] / boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "div*")
        {
            if(vm.count("verbose")) cout<<"M[0] / M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] / registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "jmp" || line[0] == "jump")
        {
            if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
            if(know_label[line[1]] == NULL)
            {
                cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                return EXIT_FAILURE;
            }
            source_file.seekg(know_label[line[1]], ios::beg);

        } else if(line[0] == "jz")
        {
            if(registers[0] == 0)
            {
                if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
                if(know_label[line[1]] == NULL)
                {
                    cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                    return EXIT_FAILURE;
                }
                source_file.seekg(know_label[line[1]], ios::beg);
            }
            else
            {
                if(vm.count("verbose")) cout<<"Can't jump: M[0] != 0 "<<endl;
            }

        } else if(line[0] == "jgz")
        {
            if(registers[0] > 0)
            {
                if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
                if(know_label[line[1]] == NULL)
                {
                    cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                    return EXIT_FAILURE;
                }
                source_file.seekg(know_label[line[1]], ios::beg);
            }
            else
            {
                if(vm.count("verbose")) cout<<"Can't jump: M[0] < 0 "<<endl;
            }

        } else if(line[0] == "label")
        {
            if(vm.count("verbose")) cout<<"Found LABEL '"<<line[1]<<"'"<<endl;

        } else if(line[0] == "debug")
        {
            if(!vm.count("verbose")) break;
            switch(boost::lexical_cast<int>(line[1]))
            {
            case 1:
                cout<<"Registers dump: "<<endl;
                for(int i = 0; i < regnumber; i++)
                {
                    cout<<"         M["<<i<<"] = "<<registers[i]<<endl;
                }
                break;
            default:
                cerr<<"<!> Invalid debug option '"<<line[1]<<"'"<<endl;
                return EXIT_FAILURE;
            }

        } else
        {
            cerr<<"<!> Syntax error '"<<fetch<<"'"<<endl;
            return EXIT_FAILURE;
        }

    }

    source_file.close();

    return EXIT_SUCCESS;
}